

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

int EVdfg_unlink_dest(EVdfg_stone source,EVdfg_stone destination)

{
  int iVar1;
  undefined8 in_RSI;
  char *in_RDI;
  CManager unaff_retaddr;
  CManager_conflict cm;
  int ret;
  int line;
  
  line = (int)((ulong)in_RSI >> 0x20);
  IntCManager_lock(unaff_retaddr,in_RDI,line);
  iVar1 = INT_EVdfg_unlink_dest(source,destination);
  IntCManager_unlock(unaff_retaddr,in_RDI,line);
  return iVar1;
}

Assistant:

extern int
EVdfg_unlink_dest ( EVdfg_stone source, EVdfg_stone destination )
{
	int ret;
	CManager cm = destination->dfg->master->cm;
	CManager_lock(cm);
	ret = INT_EVdfg_unlink_dest(source, destination);
	CManager_unlock(cm);
	return ret;
}